

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpathedit.cpp
# Opt level: O3

void QPathEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  long *plVar2;
  QIcon *icon;
  QList<QString> *this;
  QString *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  bool bVar6;
  Options OVar7;
  QArrayDataPointer<QString> *this_00;
  QArrayData *pQVar8;
  QArrayDataPointer<QString> local_c8;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_30;
  Data *local_18;
  
  this_00 = &local_c8;
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      plVar2 = (long *)_a[1];
      local_60.d.d = (Data *)*plVar2;
      local_60.d.ptr = (char16_t *)plVar2[1];
      local_60.d.size = plVar2[2];
      if ((QArrayData *)local_60.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_60.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_60.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_c8.d = (Data *)0x0;
      local_c8.ptr = &local_60;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_c8.d);
      if (&(local_60.d.d)->super_QArrayData == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar8 = &(local_60.d.d)->super_QArrayData;
      goto joined_r0x0011a04c;
    case 1:
      showDialog((QPathEdit *)_o);
      return;
    case 2:
      updateValidInfo((QPathEdit *)_o,(QString *)_a[1]);
      return;
    case 3:
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (QString *)0x0;
      local_c8.size = 0;
      updateValidInfo((QPathEdit *)_o,(QString *)&local_c8);
      break;
    case 4:
      editTextUpdate((QPathEdit *)_o);
      return;
    case 5:
      dialogFileSelected((QPathEdit *)_o,(QString *)_a[1]);
      return;
    default:
      goto switchD_00119df4_caseD_4;
    }
    goto LAB_0011a2ba;
  case ReadProperty:
    if (0xb < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (0xb < (uint)_id) {
      return;
    }
    icon = (QIcon *)*_a;
    switch(_id) {
    case 0:
      setStyle((QPathEdit *)_o,*(Style *)&icon->d,TrailingPosition);
      return;
    case 1:
      setDialogButtonIcon((QPathEdit *)_o,icon);
      return;
    case 2:
      setPathMode((QPathEdit *)_o,*(PathMode *)&icon->d);
      return;
    case 3:
      setDialogOptions((QPathEdit *)_o,(Options)*(Int *)&icon->d);
      return;
    case 4:
      setEditable((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 5:
      setAllowEmptyPath((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 6:
      setUseCompleter((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 7:
      local_78.d.d = (Data *)icon->d;
      local_78.d.ptr = (char16_t *)icon[1].d;
      local_78.d.size = (qsizetype)icon[2].d;
      if ((QArrayData *)local_78.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_78.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_78.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      setDefaultDirectory((QPathEdit *)_o,&local_78);
      if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar8 = &(local_78.d.d)->super_QArrayData;
      break;
    case 8:
      local_90.d.d = (Data *)icon->d;
      local_90.d.ptr = (char16_t *)icon[1].d;
      local_90.d.size = (qsizetype)icon[2].d;
      if ((QArrayData *)local_90.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_90.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_90.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      setPath((QPathEdit *)_o,&local_90,false);
      if (&(local_90.d.d)->super_QArrayData == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar8 = &(local_90.d.d)->super_QArrayData;
      break;
    case 9:
      local_a8.d.d = (Data *)icon->d;
      local_a8.d.ptr = (char16_t *)icon[1].d;
      local_a8.d.size = (qsizetype)icon[2].d;
      if ((QArrayData *)local_a8.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_a8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_a8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      setPlaceholder((QPathEdit *)_o,&local_a8);
      if (&(local_a8.d.d)->super_QArrayData == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      iVar1 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar8 = &(local_a8.d.d)->super_QArrayData;
      break;
    case 10:
      local_30.d = (Data *)icon->d;
      local_30.ptr = (QString *)icon[1].d;
      local_30.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_30.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_30.d = *(int *)local_30.d + 1;
        UNLOCK();
      }
      setNameFilters((QPathEdit *)_o,(QStringList *)&local_30);
      this_00 = &local_30;
      goto LAB_0011a279;
    case 0xb:
      local_48.d = (Data *)icon->d;
      local_48.ptr = (QString *)icon[1].d;
      local_48.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_48.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_48.d = *(int *)local_48.d + 1;
        UNLOCK();
      }
      setMimeTypeFilters((QPathEdit *)_o,(QStringList *)&local_48);
      this_00 = &local_48;
      goto LAB_0011a279;
    }
joined_r0x0011a04c:
    if (iVar1 != 0) {
      return;
    }
    goto LAB_0011a2c8;
  case ResetProperty:
    if (_id == 8) {
      clear((QPathEdit *)_o);
      return;
    }
    if (_id != 1) {
      return;
    }
    resetDialogButtonIcon((QPathEdit *)_o);
    return;
  default:
    goto switchD_00119df4_caseD_4;
  case IndexOfMethod:
    if ((*_a[1] == pathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto switchD_00119df4_caseD_4;
  }
  this = (QList<QString> *)*_a;
  switch(_id) {
  case 0:
    OVar7.i = style((QPathEdit *)_o);
    break;
  case 1:
    dialogButtonIcon((QPathEdit *)&local_18);
    pDVar5 = local_18;
    local_18 = (Data *)0x0;
    local_c8.d = (this->d).d;
    (this->d).d = pDVar5;
    QIcon::~QIcon((QIcon *)&local_c8);
    QIcon::~QIcon((QIcon *)&local_18);
    return;
  case 2:
    OVar7.i = pathMode((QPathEdit *)_o);
    break;
  case 3:
    OVar7 = dialogOptions((QPathEdit *)_o);
    break;
  case 4:
    bVar6 = isEditable((QPathEdit *)_o);
    goto LAB_0011a259;
  case 5:
    bVar6 = isEmptyPathAllowed((QPathEdit *)_o);
    goto LAB_0011a259;
  case 6:
    bVar6 = useCompleter((QPathEdit *)_o);
LAB_0011a259:
    *(bool *)&(this->d).d = bVar6;
    return;
  case 7:
    defaultDirectory((QPathEdit *)_o);
    goto LAB_0011a28e;
  case 8:
    path((QPathEdit *)_o);
    goto LAB_0011a28e;
  case 9:
    placeholder((QString *)&local_c8,(QPathEdit *)_o);
LAB_0011a28e:
    pQVar8 = &((this->d).d)->super_QArrayData;
    (this->d).d = local_c8.d;
    pQVar3 = (this->d).ptr;
    (this->d).ptr = local_c8.ptr;
    qVar4 = (this->d).size;
    (this->d).size = local_c8.size;
    local_c8.d = (Data *)pQVar8;
    local_c8.ptr = pQVar3;
    local_c8.size = qVar4;
LAB_0011a2ba:
    if (&(local_c8.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar8 = &(local_c8.d)->super_QArrayData;
    if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
LAB_0011a2c8:
    QArrayData::deallocate(pQVar8,2,8);
    return;
  case 10:
    nameFilters((QStringList *)&local_c8,(QPathEdit *)_o);
    goto LAB_0011a26b;
  case 0xb:
    mimeTypeFilters((QStringList *)&local_c8,(QPathEdit *)_o);
LAB_0011a26b:
    QList<QString>::operator=(this,(QList<QString> *)&local_c8);
LAB_0011a279:
    QArrayDataPointer<QString>::~QArrayDataPointer(this_00);
    return;
  }
  *(Int *)&(this->d).d = OVar7.i;
switchD_00119df4_caseD_4:
  return;
}

Assistant:

void QPathEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->showDialog(); break;
        case 2: _t->updateValidInfo((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->updateValidInfo(); break;
        case 4: _t->editTextUpdate(); break;
        case 5: _t->dialogFileSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QPathEdit::*)(QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QPathEdit::pathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Style*>(_v) = _t->style(); break;
        case 1: *reinterpret_cast< QIcon*>(_v) = _t->dialogButtonIcon(); break;
        case 2: *reinterpret_cast< PathMode*>(_v) = _t->pathMode(); break;
        case 3: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->dialogOptions(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->isEditable(); break;
        case 5: *reinterpret_cast< bool*>(_v) = _t->isEmptyPathAllowed(); break;
        case 6: *reinterpret_cast< bool*>(_v) = _t->useCompleter(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->defaultDirectory(); break;
        case 8: *reinterpret_cast< QString*>(_v) = _t->path(); break;
        case 9: *reinterpret_cast< QString*>(_v) = _t->placeholder(); break;
        case 10: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 11: *reinterpret_cast< QStringList*>(_v) = _t->mimeTypeFilters(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStyle(*reinterpret_cast< Style*>(_v)); break;
        case 1: _t->setDialogButtonIcon(*reinterpret_cast< QIcon*>(_v)); break;
        case 2: _t->setPathMode(*reinterpret_cast< PathMode*>(_v)); break;
        case 3: _t->setDialogOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        case 4: _t->setEditable(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setAllowEmptyPath(*reinterpret_cast< bool*>(_v)); break;
        case 6: _t->setUseCompleter(*reinterpret_cast< bool*>(_v)); break;
        case 7: _t->setDefaultDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 8: _t->setPath(*reinterpret_cast< QString*>(_v)); break;
        case 9: _t->setPlaceholder(*reinterpret_cast< QString*>(_v)); break;
        case 10: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 11: _t->setMimeTypeFilters(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 1: _t->resetDialogButtonIcon(); break;
        case 8: _t->clear(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}